

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O3

int intra_mode_info_cost_y
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost,
              int discount_color_cost)

{
  byte bVar1;
  ushort uVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint16_t color_cache [16];
  uint16_t local_58 [20];
  
  uVar11 = (ulong)(mbmi->filter_intra_mode_info).use_filter_intra;
  uVar2 = *(ushort *)&mbmi->field_0xa7;
  if ((cpi->common).features.allow_screen_content_tools != false) {
    bVar1 = (mbmi->palette_mode_info).palette_size[0];
    if (((0xf < mbmi->bsize) || ((0xe007U >> (mbmi->bsize & 0x1f) & 1) == 0)) &&
       (mbmi->mode == '\0')) {
      pMVar3 = (x->e_mbd).left_mbmi;
      pMVar4 = (x->e_mbd).above_mbmi;
      uVar8 = 0;
      if (pMVar4 != (MB_MODE_INFO *)0x0) {
        uVar8 = (uint)((pMVar4->palette_mode_info).palette_size[0] != '\0');
      }
      if (pMVar3 != (MB_MODE_INFO *)0x0) {
        uVar8 = (uVar8 + 1) - (uint)((pMVar3->palette_mode_info).palette_size[0] == '\0');
      }
      mode_cost = mode_cost +
                  (x->mode_costs).palette_uv_color_cost[6][0]
                  [(ulong)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] * 6 +
                   (ulong)uVar8 * 2 + (ulong)(bVar1 != 0) + 4];
      if (bVar1 != 0) {
        uVar8 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar9 = (uVar8 ^ 0xffffffe0) + 0x21;
        iVar10 = iVar9 * 0x200;
        iVar12 = iVar10 + -0x200;
        if ((int)((1 << ((byte)iVar9 & 0x1f)) - (uint)bVar1) <=
            (int)(uint)*(x->e_mbd).plane[0].color_index_map) {
          iVar12 = iVar10;
        }
        iVar9 = (x->mode_costs).cfl_cost[6][1]
                [(ulong)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize] * 7 +
                 (ulong)bVar1 + 6];
        iVar10 = av1_get_palette_cache(&x->e_mbd,0,local_58);
        iVar10 = av1_palette_color_cost_y
                           (&mbmi->palette_mode_info,local_58,iVar10,
                            ((cpi->common).seq_params)->bit_depth);
        iVar5 = av1_cost_color_map(x,0,bsize,mbmi->tx_size,'\0');
        mode_cost = mode_cost + iVar9 + iVar12 + iVar5 + iVar10;
      }
    }
  }
  bVar1 = mbmi->mode;
  if ((ulong)bVar1 == 0) {
    if (((((mbmi->palette_mode_info).palette_size[0] != '\0') ||
         (uVar7 = (ulong)mbmi->bsize, uVar7 == 0xff)) ||
        ((((cpi->common).seq_params)->enable_filter_intra == '\0' ||
         (((0x1f07ffUL >> (uVar7 & 0x3f) & 1) == 0 || ((0x2f0bffUL >> (uVar7 & 0x3f) & 1) == 0))))))
       || (mode_cost = mode_cost + (x->mode_costs).filter_intra_cost[uVar7][uVar11], uVar11 == 0))
    goto LAB_0024ceb2;
    piVar6 = (x->mode_costs).filter_intra_mode_cost +
             (mbmi->filter_intra_mode_info).filter_intra_mode;
  }
  else {
    if (bsize < BLOCK_8X8 || 8 < bVar1) goto LAB_0024ceb2;
    piVar6 = (x->mode_costs).angle_delta_cost[(ulong)bVar1 - 1] + (long)mbmi->angle_delta[0] + 3;
  }
  mode_cost = mode_cost + *piVar6;
LAB_0024ceb2:
  if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) &&
      ((cpi->common).features.allow_screen_content_tools == true)) &&
     ((cpi->common).features.allow_intrabc != false)) {
    mode_cost = mode_cost + (x->mode_costs).intrabc_cost[uVar2 >> 7 & 1];
  }
  return mode_cost;
}

Assistant:

static inline int intra_mode_info_cost_y(const AV1_COMP *cpi,
                                         const MACROBLOCK *x,
                                         const MB_MODE_INFO *mbmi,
                                         BLOCK_SIZE bsize, int mode_cost,
                                         int discount_color_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[0] > 0;
  const int use_filter_intra = mbmi->filter_intra_mode_info.use_filter_intra;
  const int use_intrabc = mbmi->use_intrabc;
  // Can only activate one mode.
  assert(((mbmi->mode != DC_PRED) + use_palette + use_intrabc +
          use_filter_intra) <= 1);
  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && mbmi->mode == DC_PRED) {
    const MACROBLOCKD *xd = &x->e_mbd;
    const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
    const int mode_ctx = av1_get_palette_mode_ctx(xd);
    total_rate +=
        mode_costs->palette_y_mode_cost[bsize_ctx][mode_ctx][use_palette];
    if (use_palette) {
      const uint8_t *const color_map = xd->plane[0].color_index_map;
      int block_width, block_height, rows, cols;
      av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                               &cols);
      const int plt_size = mbmi->palette_mode_info.palette_size[0];
      int palette_mode_cost =
          mode_costs
              ->palette_y_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 0, color_cache);
      palette_mode_cost +=
          av1_palette_color_cost_y(&mbmi->palette_mode_info, color_cache,
                                   n_cache, cpi->common.seq_params->bit_depth);
      if (!discount_color_cost)
        palette_mode_cost +=
            av1_cost_color_map(x, 0, bsize, mbmi->tx_size, PALETTE_MAP);

      total_rate += palette_mode_cost;
    }
  }
  if (av1_filter_intra_allowed(&cpi->common, mbmi)) {
    total_rate += mode_costs->filter_intra_cost[mbmi->bsize][use_filter_intra];
    if (use_filter_intra) {
      total_rate +=
          mode_costs->filter_intra_mode_cost[mbmi->filter_intra_mode_info
                                                 .filter_intra_mode];
    }
  }
  if (av1_is_directional_mode(mbmi->mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[mbmi->mode - V_PRED]
                                      [MAX_ANGLE_DELTA +
                                       mbmi->angle_delta[PLANE_TYPE_Y]];
    }
  }
  if (av1_allow_intrabc(&cpi->common))
    total_rate += mode_costs->intrabc_cost[use_intrabc];
  return total_rate;
}